

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pose2texture.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  float fVar1;
  float fVar2;
  byte bVar3;
  int iVar4;
  uint uVar5;
  ostream *poVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  string *psVar8;
  long lVar9;
  char *pcVar10;
  value_type *pvVar11;
  Vec<unsigned_char,_3> *pVVar12;
  byte *pbVar13;
  reference pvVar14;
  Vec<float,_4> *pVVar15;
  float *pfVar16;
  vector<int,_std::allocator<int>_> local_728;
  _InputArray local_710;
  allocator local_6f1;
  string local_6f0 [32];
  undefined1 local_6d0 [8];
  Vec4f texsrc_2;
  int col_3;
  int row_3;
  pointer piStack_6b0;
  pointer local_6a8;
  _InputArray local_6a0;
  allocator local_681;
  string local_680 [32];
  undefined1 local_660 [8];
  Vec4f texsrc_1;
  int col_2;
  int row_2;
  undefined1 local_4e8 [8];
  Vec4f texsrc;
  Vec3b pixsrc;
  int v;
  int u;
  int i_1;
  int iStack_4c0;
  Vec3b vui;
  uint ind;
  int col_1;
  int row_1;
  Mat local_4a8 [96];
  int local_448;
  int local_444;
  int col;
  int row;
  vector<cv::Mat,_std::allocator<cv::Mat>_> tiles;
  Size_<int> local_408;
  undefined1 local_400 [8];
  Mat texture;
  allocator local_399;
  string local_398 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_378 [32];
  undefined1 local_358 [8];
  path teximpath;
  int local_330;
  Size vuisize;
  string local_308 [8];
  Mat vuisrc;
  allocator local_2a1;
  string local_2a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280 [32];
  path local_260;
  undefined1 local_240 [8];
  path vuiimpath;
  string local_218 [36];
  MatSize local_1f4 [8];
  Size srcsize;
  string local_1c8 [8];
  Mat imgsrc;
  filesystem local_160 [32];
  undefined1 local_140 [8];
  path bgrimbasename;
  path bgrimpath;
  int i;
  int count;
  Size_<int> local_d8;
  Mat local_d0 [8];
  Mat cumul;
  path local_60;
  int local_40;
  undefined4 local_3c;
  int c;
  int option_index;
  path vuipath;
  char **argv_local;
  int argc_local;
  
  vuipath._24_8_ = argv;
  boost::filesystem::path::path((path *)&c);
  local_3c = 0;
  while (local_40 = getopt_long(argc,vuipath._24_8_,"hv:i:",long_options,&local_3c), local_40 != -1)
  {
    if ((local_40 != 0x68) && (local_40 == 0x69)) {
      boost::filesystem::path::path(&local_60,_optarg);
      boost::filesystem::path::operator=((path *)&c,&local_60);
      boost::filesystem::path::~path(&local_60);
    }
  }
  poVar6 = std::operator<<((ostream *)&std::cout,"vui-folder: ");
  pbVar7 = boost::filesystem::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,(path *)&c);
  std::ostream::operator<<((ostream *)pbVar7,std::endl<char,std::char_traits<char>>);
  cv::Size_<int>::Size_(&local_d8,800,0x4b0);
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&i,0.0,0.0,0.0,0.0);
  cv::Mat::Mat(local_d0,&local_d8,0x1d,&i);
  for (bgrimpath._24_4_ = _optind; (int)bgrimpath._24_4_ < argc;
      bgrimpath._24_4_ = bgrimpath._24_4_ + 1) {
    boost::filesystem::path::path
              ((path *)&bgrimbasename.field_0x18,
               *(value_type **)(vuipath._24_8_ + (long)(int)bgrimpath._24_4_ * 8));
    boost::filesystem::basename_abi_cxx11_(local_160,&bgrimbasename.field_0x18);
    boost::filesystem::path::path((path *)local_140,(string_type *)local_160);
    std::__cxx11::string::~string((string *)local_160);
    psVar8 = boost::filesystem::path::string_abi_cxx11_((path *)local_140);
    lVar9 = std::__cxx11::string::find((char *)psVar8,0x10d093);
    if (lVar9 == -1) {
      psVar8 = boost::filesystem::path::string_abi_cxx11_((path *)local_140);
      lVar9 = std::__cxx11::string::find((char *)psVar8,0x10d0b2);
      if (lVar9 == -1) {
        pcVar10 = *(char **)(vuipath._24_8_ + (long)(int)bgrimpath._24_4_ * 8);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&srcsize.height,pcVar10,(allocator *)((long)&srcsize.width + 3));
        cv::imread(local_1c8,(int)&srcsize + 4);
        std::__cxx11::string::~string((string *)&srcsize.height);
        std::allocator<char>::~allocator((allocator<char> *)((long)&srcsize.width + 3));
        bVar3 = cv::Mat::empty();
        if ((bVar3 & 1) == 0) {
          iVar4 = cv::Mat::channels((Mat *)local_1c8);
          if (iVar4 == 3) {
            cv::MatSize::operator()(local_1f4);
            poVar6 = std::operator<<((ostream *)&std::cout,"processing: ");
            pcVar10 = *(char **)(vuipath._24_8_ + (long)(int)bgrimpath._24_4_ * 8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_218,pcVar10,(allocator *)&vuiimpath.field_0x1f);
            poVar6 = std::operator<<(poVar6,local_218);
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            std::__cxx11::string::~string(local_218);
            std::allocator<char>::~allocator((allocator<char> *)&vuiimpath.field_0x1f);
            psVar8 = boost::filesystem::path::string_abi_cxx11_((path *)local_140);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_2a0,"_IUV.png",&local_2a1);
            std::operator+(local_280,psVar8);
            boost::filesystem::path::path(&local_260,local_280);
            boost::filesystem::operator/((path *)local_240,(path *)&c,&local_260);
            boost::filesystem::path::~path(&local_260);
            std::__cxx11::string::~string((string *)local_280);
            std::__cxx11::string::~string(local_2a0);
            std::allocator<char>::~allocator((allocator<char> *)&local_2a1);
            poVar6 = std::operator<<((ostream *)&std::cout,"\t- ");
            pbVar7 = boost::filesystem::operator<<
                               ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,
                                (path *)local_240);
            std::ostream::operator<<((ostream *)pbVar7,std::endl<char,std::char_traits<char>>);
            pvVar11 = boost::filesystem::path::c_str((path *)local_240);
            std::allocator<char>::allocator();
            std::__cxx11::string::string
                      ((string *)&vuisize.height,pvVar11,(allocator *)((long)&vuisize.width + 3));
            cv::imread(local_308,(int)&vuisize + 4);
            std::__cxx11::string::~string((string *)&vuisize.height);
            std::allocator<char>::~allocator((allocator<char> *)((long)&vuisize.width + 3));
            bVar3 = cv::Mat::empty();
            if ((bVar3 & 1) == 0) {
              iVar4 = cv::Mat::channels((Mat *)local_308);
              if (iVar4 == 3) {
                cv::MatSize::operator()((MatSize *)&teximpath.field_0x1c);
                psVar8 = boost::filesystem::path::string_abi_cxx11_((path *)local_140);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_398,"_TEX.png",&local_399);
                std::operator+(local_378,psVar8);
                boost::filesystem::path::path((path *)local_358,local_378);
                std::__cxx11::string::~string((string *)local_378);
                std::__cxx11::string::~string(local_398);
                std::allocator<char>::~allocator((allocator<char> *)&local_399);
                poVar6 = std::operator<<((ostream *)&std::cout,"\t- ");
                pbVar7 = boost::filesystem::operator<<
                                   ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,
                                    (path *)local_358);
                std::ostream::operator<<((ostream *)pbVar7,std::endl<char,std::char_traits<char>>);
                cv::Size_<int>::Size_(&local_408,800,0x4b0);
                cv::Scalar_<double>::Scalar_
                          ((Scalar_<double> *)
                           &tiles.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,0.0,0.0,0.0,0.0);
                cv::Mat::Mat((Mat *)local_400,&local_408,0x1d,
                             &tiles.super__Vector_base<cv::Mat,_std::allocator<cv::Mat>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage);
                std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&col);
                for (local_444 = 0; local_444 < 4; local_444 = local_444 + 1) {
                  for (local_448 = 0; local_448 < 6; local_448 = local_448 + 1) {
                    cv::Rect_<int>::Rect_
                              ((Rect_<int> *)&col_1,local_444 * 200,local_448 * 200,200,200);
                    cv::Mat::operator()(local_4a8,(Rect *)local_400);
                    std::vector<cv::Mat,_std::allocator<cv::Mat>_>::push_back
                              ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&col,local_4a8);
                    cv::Mat::~Mat(local_4a8);
                  }
                }
                for (ind = 0; (int)ind < local_330; ind = ind + 1) {
                  for (iStack_4c0 = 0; iStack_4c0 < (int)teximpath._28_4_;
                      iStack_4c0 = iStack_4c0 + 1) {
                    i_1 = 0;
                    pVVar12 = cv::Mat::at<cv::Vec<unsigned_char,3>>((Mat *)local_308,ind,iStack_4c0)
                    ;
                    cv::Vec<unsigned_char,_3>::Vec((Vec<unsigned_char,_3> *)((long)&u + 1),pVVar12);
                    pbVar13 = cv::Vec<unsigned_char,_3>::operator[]
                                        ((Vec<unsigned_char,_3> *)((long)&u + 1),0);
                    bVar3 = *pbVar13;
                    uVar5 = bVar3 & 0x1f;
                    pbVar13 = cv::Vec<unsigned_char,_3>::operator[]
                                        ((Vec<unsigned_char,_3> *)((long)&u + 1),2);
                    iVar4 = (int)(((255.0 - (double)*pbVar13) * 199.0) / 255.0);
                    pbVar13 = cv::Vec<unsigned_char,_3>::operator[]
                                        ((Vec<unsigned_char,_3> *)((long)&u + 1),1);
                    texsrc.super_Matx<float,_4,_1>.val[3] =
                         (float)(int)(((double)*pbVar13 * 199.0) / 255.0);
                    if ((((((bVar3 & 0x1f) != 0) && (uVar5 < 0x19)) && (-1 < iVar4)) &&
                        ((iVar4 < 200 && (-1 < (int)texsrc.super_Matx<float,_4,_1>.val[3])))) &&
                       ((int)texsrc.super_Matx<float,_4,_1>.val[3] < 200)) {
                      pVVar12 = cv::Mat::at<cv::Vec<unsigned_char,3>>
                                          ((Mat *)local_1c8,ind,iStack_4c0);
                      cv::Vec<unsigned_char,_3>::Vec
                                ((Vec<unsigned_char,_3> *)
                                 ((long)texsrc.super_Matx<float,_4,_1>.val + 9),pVVar12);
                      pvVar14 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&col,
                                           (long)(int)(uVar5 - 1));
                      pVVar15 = cv::Mat::at<cv::Vec<float,4>>
                                          (pvVar14,iVar4,(int)texsrc.super_Matx<float,_4,_1>.val[3])
                      ;
                      cv::Vec<float,_4>::Vec((Vec<float,_4> *)local_4e8,pVVar15);
                      pbVar13 = cv::Vec<unsigned_char,_3>::operator[]
                                          ((Vec<unsigned_char,_3> *)
                                           ((long)texsrc.super_Matx<float,_4,_1>.val + 9),0);
                      bVar3 = *pbVar13;
                      pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_4e8,0);
                      *pfVar16 = *pfVar16 + (float)bVar3;
                      pbVar13 = cv::Vec<unsigned_char,_3>::operator[]
                                          ((Vec<unsigned_char,_3> *)
                                           ((long)texsrc.super_Matx<float,_4,_1>.val + 9),1);
                      bVar3 = *pbVar13;
                      pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_4e8,1);
                      *pfVar16 = *pfVar16 + (float)bVar3;
                      pbVar13 = cv::Vec<unsigned_char,_3>::operator[]
                                          ((Vec<unsigned_char,_3> *)
                                           ((long)texsrc.super_Matx<float,_4,_1>.val + 9),2);
                      bVar3 = *pbVar13;
                      pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_4e8,2);
                      *pfVar16 = *pfVar16 + (float)bVar3;
                      pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_4e8,3);
                      *pfVar16 = *pfVar16 + 1.0;
                      pvVar14 = std::vector<cv::Mat,_std::allocator<cv::Mat>_>::operator[]
                                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&col,
                                           (long)(int)(uVar5 - 1));
                      pVVar15 = cv::Mat::at<cv::Vec<float,4>>
                                          (pvVar14,iVar4,(int)texsrc.super_Matx<float,_4,_1>.val[3])
                      ;
                      *(undefined1 (*) [8])(pVVar15->super_Matx<float,_4,_1>).val = local_4e8;
                      *(undefined8 *)((pVVar15->super_Matx<float,_4,_1>).val + 2) =
                           texsrc.super_Matx<float,_4,_1>.val._0_8_;
                    }
                  }
                }
                cv::operator+((Mat *)&col_2,local_d0);
                cv::Mat::operator=(local_d0,(MatExpr *)&col_2);
                cv::MatExpr::~MatExpr((MatExpr *)&col_2);
                for (texsrc_1.super_Matx<float,_4,_1>.val[3] = 0.0;
                    (int)texsrc_1.super_Matx<float,_4,_1>.val[3] < 0x4b0;
                    texsrc_1.super_Matx<float,_4,_1>.val[3] =
                         (float)((int)texsrc_1.super_Matx<float,_4,_1>.val[3] + 1)) {
                  for (texsrc_1.super_Matx<float,_4,_1>.val[2] = 0.0;
                      (int)texsrc_1.super_Matx<float,_4,_1>.val[2] < 800;
                      texsrc_1.super_Matx<float,_4,_1>.val[2] =
                           (float)((int)texsrc_1.super_Matx<float,_4,_1>.val[2] + 1)) {
                    pVVar15 = cv::Mat::at<cv::Vec<float,4>>
                                        ((Mat *)local_400,
                                         (int)texsrc_1.super_Matx<float,_4,_1>.val[3],
                                         (int)texsrc_1.super_Matx<float,_4,_1>.val[2]);
                    cv::Vec<float,_4>::Vec((Vec<float,_4> *)local_660,pVVar15);
                    pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_660,0);
                    fVar1 = *pfVar16;
                    pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_660,3);
                    fVar2 = *pfVar16;
                    pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_660,0);
                    *pfVar16 = fVar1 / fVar2;
                    pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_660,1);
                    fVar1 = *pfVar16;
                    pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_660,3);
                    fVar2 = *pfVar16;
                    pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_660,1);
                    *pfVar16 = fVar1 / fVar2;
                    pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_660,2);
                    fVar1 = *pfVar16;
                    pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_660,3);
                    fVar2 = *pfVar16;
                    pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_660,2);
                    *pfVar16 = fVar1 / fVar2;
                    pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_660,3);
                    fVar1 = 255.0;
                    if ((*pfVar16 == 0.0) && (fVar1 = 255.0, !NAN(*pfVar16))) {
                      fVar1 = 0.0;
                    }
                    pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_660,3);
                    *pfVar16 = fVar1;
                    pVVar15 = cv::Mat::at<cv::Vec<float,4>>
                                        ((Mat *)local_400,
                                         (int)texsrc_1.super_Matx<float,_4,_1>.val[3],
                                         (int)texsrc_1.super_Matx<float,_4,_1>.val[2]);
                    *(undefined1 (*) [8])(pVVar15->super_Matx<float,_4,_1>).val = local_660;
                    *(undefined8 *)((pVVar15->super_Matx<float,_4,_1>).val + 2) =
                         texsrc_1.super_Matx<float,_4,_1>.val._0_8_;
                  }
                }
                pvVar11 = boost::filesystem::path::c_str((path *)local_358);
                std::allocator<char>::allocator();
                std::__cxx11::string::string(local_680,pvVar11,&local_681);
                cv::_InputArray::_InputArray(&local_6a0,(Mat *)local_400);
                _col_3 = (pointer)0x0;
                piStack_6b0 = (pointer)0x0;
                local_6a8 = (pointer)0x0;
                std::vector<int,_std::allocator<int>_>::vector
                          ((vector<int,_std::allocator<int>_> *)&col_3);
                cv::imwrite(local_680,&local_6a0,(vector *)&col_3);
                std::vector<int,_std::allocator<int>_>::~vector
                          ((vector<int,_std::allocator<int>_> *)&col_3);
                cv::_InputArray::~_InputArray(&local_6a0);
                std::__cxx11::string::~string(local_680);
                std::allocator<char>::~allocator((allocator<char> *)&local_681);
                std::ostream::operator<<
                          ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
                std::vector<cv::Mat,_std::allocator<cv::Mat>_>::~vector
                          ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)&col);
                cv::Mat::~Mat((Mat *)local_400);
                boost::filesystem::path::~path((path *)local_358);
              }
              else {
                pcVar10 = basename(*(char **)vuipath._24_8_);
                poVar6 = std::operator<<((ostream *)&std::cerr,pcVar10);
                poVar6 = std::operator<<(poVar6,": image file is not RGB \'");
                pbVar7 = boost::filesystem::operator<<
                                   ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,
                                    (path *)local_240);
                poVar6 = std::operator<<((ostream *)pbVar7,"\'");
                std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
              }
            }
            else {
              pcVar10 = basename(*(char **)vuipath._24_8_);
              poVar6 = std::operator<<((ostream *)&std::cerr,pcVar10);
              poVar6 = std::operator<<(poVar6,": could not open file or invalid image file  \'");
              pbVar7 = boost::filesystem::operator<<
                                 ((basic_ostream<char,_std::char_traits<char>_> *)poVar6,
                                  (path *)local_240);
              poVar6 = std::operator<<((ostream *)pbVar7,"\'");
              std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
            }
            cv::Mat::~Mat((Mat *)local_308);
            boost::filesystem::path::~path((path *)local_240);
          }
          else {
            pcVar10 = basename(*(char **)vuipath._24_8_);
            poVar6 = std::operator<<((ostream *)&std::cerr,pcVar10);
            poVar6 = std::operator<<(poVar6,": image file is not RGB \'");
            poVar6 = std::operator<<(poVar6,*(char **)(vuipath._24_8_ +
                                                      (long)(int)bgrimpath._24_4_ * 8));
            poVar6 = std::operator<<(poVar6,"\'");
            std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          }
        }
        else {
          pcVar10 = basename(*(char **)vuipath._24_8_);
          poVar6 = std::operator<<((ostream *)&std::cerr,pcVar10);
          poVar6 = std::operator<<(poVar6,": could not open file or invalid image file  \'");
          poVar6 = std::operator<<(poVar6,*(char **)(vuipath._24_8_ +
                                                    (long)(int)bgrimpath._24_4_ * 8));
          poVar6 = std::operator<<(poVar6,"\'");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        }
        cv::Mat::~Mat((Mat *)local_1c8);
      }
      else {
        pcVar10 = basename(*(char **)vuipath._24_8_);
        poVar6 = std::operator<<((ostream *)&std::cerr,pcVar10);
        poVar6 = std::operator<<(poVar6,": skipping _IUV file  \'");
        poVar6 = std::operator<<(poVar6,*(char **)(vuipath._24_8_ + (long)(int)bgrimpath._24_4_ * 8)
                                );
        poVar6 = std::operator<<(poVar6,"\'");
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      }
    }
    else {
      pcVar10 = basename(*(char **)vuipath._24_8_);
      poVar6 = std::operator<<((ostream *)&std::cerr,pcVar10);
      poVar6 = std::operator<<(poVar6,": skipping _INDS file  \'");
      poVar6 = std::operator<<(poVar6,*(char **)(vuipath._24_8_ + (long)(int)bgrimpath._24_4_ * 8));
      poVar6 = std::operator<<(poVar6,"\'");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
    }
    boost::filesystem::path::~path((path *)local_140);
    boost::filesystem::path::~path((path *)&bgrimbasename.field_0x18);
  }
  for (texsrc_2.super_Matx<float,_4,_1>.val[3] = 0.0;
      (int)texsrc_2.super_Matx<float,_4,_1>.val[3] < 0x4b0;
      texsrc_2.super_Matx<float,_4,_1>.val[3] =
           (float)((int)texsrc_2.super_Matx<float,_4,_1>.val[3] + 1)) {
    for (texsrc_2.super_Matx<float,_4,_1>.val[2] = 0.0;
        (int)texsrc_2.super_Matx<float,_4,_1>.val[2] < 800;
        texsrc_2.super_Matx<float,_4,_1>.val[2] =
             (float)((int)texsrc_2.super_Matx<float,_4,_1>.val[2] + 1)) {
      pVVar15 = cv::Mat::at<cv::Vec<float,4>>
                          (local_d0,(int)texsrc_2.super_Matx<float,_4,_1>.val[3],
                           (int)texsrc_2.super_Matx<float,_4,_1>.val[2]);
      cv::Vec<float,_4>::Vec((Vec<float,_4> *)local_6d0,pVVar15);
      pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_6d0,0);
      fVar1 = *pfVar16;
      pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_6d0,3);
      fVar2 = *pfVar16;
      pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_6d0,0);
      *pfVar16 = fVar1 / fVar2;
      pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_6d0,1);
      fVar1 = *pfVar16;
      pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_6d0,3);
      fVar2 = *pfVar16;
      pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_6d0,1);
      *pfVar16 = fVar1 / fVar2;
      pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_6d0,2);
      fVar1 = *pfVar16;
      pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_6d0,3);
      fVar2 = *pfVar16;
      pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_6d0,2);
      *pfVar16 = fVar1 / fVar2;
      pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_6d0,3);
      fVar1 = 255.0;
      if ((*pfVar16 == 0.0) && (fVar1 = 255.0, !NAN(*pfVar16))) {
        fVar1 = 0.0;
      }
      pfVar16 = cv::Vec<float,_4>::operator[]((Vec<float,_4> *)local_6d0,3);
      *pfVar16 = fVar1;
      pVVar15 = cv::Mat::at<cv::Vec<float,4>>
                          (local_d0,(int)texsrc_2.super_Matx<float,_4,_1>.val[3],
                           (int)texsrc_2.super_Matx<float,_4,_1>.val[2]);
      *(undefined1 (*) [8])(pVVar15->super_Matx<float,_4,_1>).val = local_6d0;
      *(undefined8 *)((pVVar15->super_Matx<float,_4,_1>).val + 2) =
           texsrc_2.super_Matx<float,_4,_1>.val._0_8_;
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_6f0,"cumul.png",&local_6f1);
  cv::_InputArray::_InputArray(&local_710,local_d0);
  local_728.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_728.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  local_728.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::vector<int,_std::allocator<int>_>::vector(&local_728);
  cv::imwrite(local_6f0,&local_710,(vector *)&local_728);
  std::vector<int,_std::allocator<int>_>::~vector(&local_728);
  cv::_InputArray::~_InputArray(&local_710);
  std::__cxx11::string::~string(local_6f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_6f1);
  cv::Mat::~Mat(local_d0);
  boost::filesystem::path::~path((path *)&c);
  return 0;
}

Assistant:

int main(int argc, char** argv )
{
    boost::filesystem::path vuipath;

    int 	option_index = 0;
    while(1) {
        int c = getopt_long (argc, argv, "hv:i:",long_options, &option_index);
        if (c == -1)
            break;  // end of options
        switch (c) {
        case 'v':
            //verbose_level=atoi(optarg);
            break;
        case 'h':
            //usage(cerr,basename(argv[0]));
            //exit(1);
            break;		// never reached
        case 'i':
            // path to _INDS.png and _IUV.png folder
            vuipath=boost::filesystem::path(optarg);
            break;
        }
    }


    cout << "vui-folder: " << vuipath << endl;
    Mat   cumul(Size(800,1200),CV_32FC4,Scalar(0,0,0,0));
    int count=0;

    for(int i=optind; i<argc; i++) {
        boost::filesystem::path bgrimpath(argv[i]);
        boost::filesystem::path bgrimbasename=basename(bgrimpath);
        // skip *_INDS.png, *._IUV.png
        if(string::npos!=bgrimbasename.string().find("_INDS")) {
            cerr << basename(argv[0]) << ": skipping _INDS file  '" << argv[i] << "'" << endl;
            continue;
        }
        if(string::npos!=bgrimbasename.string().find("_IUV")) {
            cerr << basename(argv[0]) << ": skipping _IUV file  '" << argv[i] << "'" << endl;
            continue;
        }

        // read the source image file
        Mat imgsrc=imread(argv[i],1);
        if(imgsrc.empty()) {
            cerr << basename(argv[0]) << ": could not open file or invalid image file  '" << argv[i] << "'" << endl;
            continue;
        }
        if(imgsrc.channels()!=3) {
            cerr << basename(argv[0]) << ": image file is not RGB '" << argv[i] << "'" << endl;
            continue;
        }

        Size srcsize=imgsrc.size();

        cout << "processing: " << string(argv[i]) << endl;

        // get IUV file
        boost::filesystem::path vuiimpath= vuipath / boost::filesystem::path(bgrimbasename.string() + string("_IUV.png"));
        cout << "\t- " << vuiimpath << endl;

        Mat vuisrc=imread(vuiimpath.c_str(),1);
        if(vuisrc.empty()) {
            cerr << basename(argv[0]) << ": could not open file or invalid image file  '" << vuiimpath << "'" << endl;
            continue;
        }
        if(vuisrc.channels()!=3) {
            cerr << basename(argv[0]) << ": image file is not RGB '" << vuiimpath << "'" << endl;
            continue;
        }
        Size vuisize=vuisrc.size();
        /*
        // get INDS file
        boost::filesystem::path indimpath= vuipath / boost::filesystem::path(bgrimbasename.string() + string("_INDS.png"));
        cout << "\t- " << indimpath << endl;

        Mat indsrc=imread(indimpath.c_str(),-1);
        if(indsrc.empty()) {
            cerr << basename(argv[0]) << ": could not open file or invalid image file  '" << indimpath << "'" << endl;
            continue;
        }
        if(indsrc.channels()!=1) {
            cerr << basename(argv[0]) << ": image file is not 1 channel'" << indimpath << "'" << endl;
            continue;
        }
        Size indsize=indsrc.size();

        // get number of different values in ind matrix => should be nb of people seen
        std::vector<unsigned char> unik = unique(indsrc, true);

        for (unsigned int i = 0; i < unik.size(); i++)
            std::cout << (short)unik[i] << " ";
        */
        boost::filesystem::path teximpath= boost::filesystem::path(bgrimbasename.string() + string("_TEX.png"));
        cout << "\t- " << teximpath << endl;



        Mat   texture(Size(800,1200),CV_32FC4,Scalar(0,0,0,0));
        //Mat   texture=imread("SURREAL.png",1);
        //4x6=24 tiles, tile size 200*200
        vector<Mat>  tiles;
        for(int row=0; row<4; row++)
            for(int col=0; col<6; col++)
                tiles.push_back(texture(Rect(200*row,200*col,200,200)));


        //Mat   out=imgsrc;
        //out=Scalar(0,0,0);
        for(int row=0; row<vuisize.height; row++)
            for(int col=0; col<vuisize.width; col++) {
                unsigned int ind=0;
                Vec3b        vui=vuisrc.at<Vec3b>(row,col);

                int i= (unsigned)0x1F & vui[0];
                int u=(255.-float(vui[2]))*199./255.;
                int v=float(vui[1])*199./255.;
                /*
                if((i>0)&&(i<25))
                    if((u>=0)&&(u<200))
                        if((v>=0)&&(v<200))
                out.at<Vec3b>(row,col)=tiles[i-1].at<Vec3b>(u,v);
                */
                if((i>0)&&(i<25))
                    if((u>=0)&&(u<200))
                        if((v>=0)&&(v<200)) {
                            Vec3b pixsrc=imgsrc.at<Vec3b>(row,col); // image pixel
                            Vec4f texsrc=tiles[i-1].at<Vec4f>(u,v);
                            texsrc[0]+=(float)pixsrc[0];
                            texsrc[1]+=(float)pixsrc[1];
                            texsrc[2]+=(float)pixsrc[2];
                            texsrc[3]+=(float)1.0;
                            tiles[i-1].at<Vec4f>(u,v)=texsrc;
                            //tiles[i-1].at<Vec3b>(u,v)=imgsrc.at<Vec3b>(row,col);
                        }
            }
        cumul=cumul+texture;
        count+=1;
        for(int row=0; row<1200; row++)
            for(int col=0; col<800; col++) {
                Vec4f texsrc=texture.at<Vec4f>(row,col);
                texsrc[0]=float(texsrc[0])/float(texsrc[3]);
                texsrc[1]=float(texsrc[1])/float(texsrc[3]);
                texsrc[2]=float(texsrc[2])/float(texsrc[3]);
                texsrc[3]=(float)(texsrc[3] ? 255.0:0.0);
                texture.at<Vec4f>(row,col)=texsrc;
            }
        imwrite(teximpath.c_str(),texture);

        cout << endl;
    }

    for(int row=0; row<1200; row++)
        for(int col=0; col<800; col++) {
            Vec4f texsrc=cumul.at<Vec4f>(row,col);
            texsrc[0]=float(texsrc[0])/float(texsrc[3]);
            texsrc[1]=float(texsrc[1])/float(texsrc[3]);
            texsrc[2]=float(texsrc[2])/float(texsrc[3]);
            //texsrc[3]=(float)255.0;
            texsrc[3]=(float)(texsrc[3] ? 255.0:0.0);
            cumul.at<Vec4f>(row,col)=texsrc;
        }
    imwrite("cumul.png",cumul);

    return 0;
}